

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O0

int cymric_derive(cymric_rng *basisGenerator,void *seedBuffer,int seedBytes,cymric_rng *resultOut)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  cymric_rng *in_RSI;
  long in_RDI;
  char key [64];
  blake2b_state state;
  undefined1 auStackY_240 [8];
  uint64_t in_stack_fffffffffffffdc8;
  uint8_t *in_stack_fffffffffffffdd0;
  blake2b_state *in_stack_fffffffffffffdd8;
  uint8_t in_stack_fffffffffffffdff;
  uint8_t *in_stack_fffffffffffffe00;
  blake2b_state *in_stack_fffffffffffffe08;
  undefined1 auStack_1a0 [31];
  uint8_t in_stack_fffffffffffffe7f;
  void *in_stack_fffffffffffffe80;
  uint8_t in_stack_fffffffffffffe8f;
  blake2b_state *in_stack_fffffffffffffe90;
  undefined4 in_stack_ffffffffffffff90;
  int local_54;
  
  if ((in_RCX == 0) || (in_RDI == 0)) {
    local_54 = -1;
  }
  else {
    iVar1 = blake2b_init_key(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f,
                             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7f);
    if (iVar1 == 0) {
      if (((in_RSI == (cymric_rng *)0x0) || (in_EDX < 1)) ||
         (iVar1 = blake2b_update(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                 in_stack_fffffffffffffdc8), iVar1 == 0)) {
        iVar1 = cymric_random(in_RSI,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
                              (int)((ulong)in_RCX >> 0x20));
        if (iVar1 == 0) {
          iVar1 = blake2b_update(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                 in_stack_fffffffffffffdc8);
          if (iVar1 == 0) {
            iVar1 = blake2b_final(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                  in_stack_fffffffffffffdff);
            if (iVar1 == 0) {
              secure_zero_memory(auStack_1a0,0x100);
              secure_zero_memory(auStackY_240,0x40);
              *(undefined1 *)(in_RCX + 0x40) = 0x53;
              *(undefined1 *)(in_RCX + 0x41) = 0x45;
              *(undefined1 *)(in_RCX + 0x42) = 0x45;
              *(undefined1 *)(in_RCX + 0x43) = 0x44;
              local_54 = 0;
            }
            else {
              local_54 = -6;
            }
          }
          else {
            local_54 = -5;
          }
        }
        else {
          local_54 = -4;
        }
      }
      else {
        local_54 = -3;
      }
    }
    else {
      local_54 = -2;
    }
  }
  return local_54;
}

Assistant:

int cymric_derive(
    cymric_rng* basisGenerator, ///< [in] Generator to seed from
    const void* seedBuffer,     ///< [in] Additional seed buffer
    int seedBytes,              ///< [in] Seed buffer bytes
    cymric_rng* resultOut       ///< [out] Generator to seed
) {
    // If input is invalid:
    if (!resultOut || !basisGenerator)
        return -1;

    // Initialize BLAKE2 state for 512-bit output
    blake2b_state state;

    // Mix in previous or uninitialized state
    if (blake2b_init_key(&state, 64, resultOut->internal, 64))
        return -2;

    // Mix in the seed
    if (seedBuffer && seedBytes > 0) {
        if (blake2b_update(&state, (const uint8_t *)seedBuffer, seedBytes))
            return -3;
    }

    // Generate a key seed from the old RNG
    char key[64];
    if (cymric_random(basisGenerator, key, 64))
        return -4;

    // Mix in the key seed
    if (blake2b_update(&state, (const uint8_t *)key, 64))
        return -5;

    // Squeeze out 512 random bits from seed
    if (blake2b_final(&state, (uint8_t *)resultOut->internal, 64))
        return -6;

    // Erase BLAKE2 state and key
    CAT_SECURE_OBJCLR(state.buf);
    CAT_SECURE_OBJCLR(key);

    // Indicate state is seeded
    resultOut->internal[64] = 'S';
    resultOut->internal[65] = 'E';
    resultOut->internal[66] = 'E';
    resultOut->internal[67] = 'D';

    return 0;
}